

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Count.cc
# Opt level: O0

ssize_t __thiscall Pl_Count::write(Pl_Count *this,int __fd,void *__buf,size_t __n)

{
  uchar uVar1;
  int iVar2;
  qpdf_offset_t qVar3;
  pointer pMVar4;
  Pipeline *pPVar5;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  void *local_20;
  size_t len_local;
  uchar *buf_local;
  Pl_Count *this_local;
  
  len_local = CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    local_20 = __buf;
    buf_local = (uchar *)this;
    qVar3 = QIntC::to_offset<unsigned_long>((unsigned_long *)&local_20);
    pMVar4 = std::unique_ptr<Pl_Count::Members,_std::default_delete<Pl_Count::Members>_>::operator->
                       (&this->m);
    pMVar4->count = qVar3 + pMVar4->count;
    uVar1 = *(uchar *)((long)local_20 + (len_local - 1));
    pMVar4 = std::unique_ptr<Pl_Count::Members,_std::default_delete<Pl_Count::Members>_>::operator->
                       (&this->m);
    pMVar4->last_char = uVar1;
    pPVar5 = Pipeline::next(&this->super_Pipeline);
    iVar2 = (*pPVar5->_vptr_Pipeline[2])(pPVar5,len_local,local_20);
    this = (Pl_Count *)CONCAT44(extraout_var,iVar2);
  }
  return (ssize_t)this;
}

Assistant:

void
Pl_Count::write(unsigned char const* buf, size_t len)
{
    if (len) {
        m->count += QIntC::to_offset(len);
        m->last_char = buf[len - 1];
        next()->write(buf, len);
    }
}